

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noop.cc
# Opt level: O2

base_learner * noop_setup(options_i *options,vw *param_2)

{
  learner<char,_example> *plVar1;
  bool noop;
  allocator local_142;
  allocator local_141;
  string local_140 [32];
  string local_120;
  string local_100;
  option_group_definition new_options;
  undefined1 local_a8 [112];
  bool local_38;
  
  noop = false;
  std::__cxx11::string::string((string *)&local_100,"Noop Learner",(allocator *)local_a8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string((string *)&local_120,"noop",&local_141);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_a8,&local_120,&noop);
  local_38 = true;
  std::__cxx11::string::string(local_140,"do no learning",&local_142);
  std::__cxx11::string::_M_assign((string *)(local_a8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)local_a8);
  std::__cxx11::string::~string(local_140);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_a8);
  std::__cxx11::string::~string((string *)&local_120);
  (**options->_vptr_options_i)(options,&new_options);
  if (noop == false) {
    plVar1 = (learner<char,_example> *)0x0;
  }
  else {
    plVar1 = LEARNER::init_learner<char,example,LEARNER::learner<char,char>>(learn,1);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return (base_learner *)plVar1;
}

Assistant:

LEARNER::base_learner* noop_setup(options_i& options, vw&)
{
  bool noop = false;
  option_group_definition new_options("Noop Learner");
  new_options.add(make_option("noop", noop).keep().help("do no learning"));
  options.add_and_parse(new_options);

  if (!noop)
    return nullptr;

  return make_base(LEARNER::init_learner(learn, 1));
}